

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmpIO.cpp
# Opt level: O3

void __thiscall AmpIO::CheckCollectCallback(AmpIO *this)

{
  bool bVar1;
  ushort uVar2;
  uint uVar3;
  undefined8 in_RAX;
  ostream *poVar4;
  unsigned_short nquads;
  uchar fpgaChan;
  bool fpgaCollecting;
  unsigned_short collect_windex;
  undefined8 uStack_28;
  
  if (this->collect_cb == (CollectCallback)0x0) {
    return;
  }
  uStack_28 = in_RAX;
  bVar1 = GetCollectionStatus(this,(bool *)((long)&uStack_28 + 5),(uchar *)((long)&uStack_28 + 4),
                              (unsigned_short *)((long)&uStack_28 + 6));
  if (!bVar1) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"CheckCollectCallback: failed to get collection status",0x35);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x10);
    std::ostream::put(-0x10);
    std::ostream::flush();
    return;
  }
  if ((this->collect_state == true) && (uStack_28._5_1_ != '\x01')) {
    return;
  }
  if (uStack_28._4_1_ != this->collect_chan) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"CheckCollectCallback: channel mismatch: ",0x28);
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,", ",2);
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
  }
  uVar2 = uStack_28._6_2_ + 0x400;
  if (this->collect_rindex <= uStack_28._6_2_) {
    uVar2 = uStack_28._6_2_;
  }
  nquads = uVar2 - this->collect_rindex;
  if (nquads != 0) {
    uVar3 = (*((this->super_FpgaIO).super_BoardIO.port)->_vptr_BasePort[0x19])();
    if (uVar3 >> 2 < (uint)nquads) {
      uVar3 = (*((this->super_FpgaIO).super_BoardIO.port)->_vptr_BasePort[0x19])();
      nquads = (unsigned_short)(uVar3 >> 2);
    }
    bVar1 = ReadCollectedData(this,this->collect_data,this->collect_rindex,nquads);
    if (bVar1) {
      uVar2 = this->collect_rindex + nquads;
      this->collect_rindex = uVar2;
      if (0x3ff < uVar2) {
        this->collect_rindex = uVar2 - 0x400;
      }
      goto LAB_00109e48;
    }
  }
  nquads = 0;
LAB_00109e48:
  bVar1 = (*this->collect_cb)(this->collect_data,nquads);
  if (!bVar1) {
    this->collect_state = false;
  }
  return;
}

Assistant:

void AmpIO::CheckCollectCallback()
{
    if (collect_cb == 0) return;
    bool fpgaCollecting;
    unsigned char fpgaChan;
    unsigned short collect_windex;
    if (!GetCollectionStatus(fpgaCollecting, fpgaChan, collect_windex)) {
        std::cerr << "CheckCollectCallback: failed to get collection status" << std::endl;
        return;
    }
    // Wait to make sure FPGA is collecting data
    if (collect_state && !fpgaCollecting)
        return;
    if (fpgaChan != collect_chan) {
        std::cerr << "CheckCollectCallback: channel mismatch: "
                  << static_cast<unsigned int>(fpgaChan) << ", "
                  << static_cast<unsigned int>(collect_chan) << std::endl;
        // Continue processing
    }
    // Figure out how much data is available
    // (this implementation works correctly for unsigned integers)
    unsigned short numAvail = (collect_windex >= collect_rindex) ? (collect_windex-collect_rindex)
                                                                 : (COLLECT_BUFSIZE +collect_windex-collect_rindex);
    if (numAvail > 0) {
        if (numAvail > (port->GetMaxReadDataSize()/sizeof(quadlet_t)))
            numAvail = static_cast<unsigned short>(port->GetMaxReadDataSize()/sizeof(quadlet_t));
        if (ReadCollectedData(collect_data, collect_rindex, numAvail)) {
            collect_rindex += numAvail;
            if (collect_rindex >= COLLECT_BUFSIZE)
                collect_rindex -= COLLECT_BUFSIZE;
        }
        else
            numAvail = 0;
    }
    if (!(*collect_cb)(collect_data, numAvail))
        DataCollectionStop();
}